

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapTest.cpp
# Opt level: O1

void relational_operator<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *t1,
               char *s1,map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *t2,char *s2)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  size_t sVar4;
  
  if (s1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1150d0);
  }
  else {
    sVar4 = strlen(s1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s1,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is...",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  if ((t1->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
      (t2->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar3 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,std::_Rb_tree_const_iterator<std::pair<int_const,int>>>
                      ((t1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<const_int,_int>_>)
                       &(t1->_M_t)._M_impl.super__Rb_tree_header,
                       (t2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"equal to",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
    }
  }
  if ((t1->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
      (t2->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar3 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,std::_Rb_tree_const_iterator<std::pair<int_const,int>>>
                      ((t1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<const_int,_int>_>)
                       &(t1->_M_t)._M_impl.super__Rb_tree_header,
                       (t2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
    if (bVar3) goto LAB_001082f1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not equal to",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
LAB_001082f1:
  p_Var2 = &(t1->_M_t)._M_impl.super__Rb_tree_header;
  p_Var1 = &(t2->_M_t)._M_impl.super__Rb_tree_header;
  bVar3 = std::
          __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,std::_Rb_tree_const_iterator<std::pair<int_const,int>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((t1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,
                     (t2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"smaller than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  bVar3 = std::
          __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,std::_Rb_tree_const_iterator<std::pair<int_const,int>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((t2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
                     (t1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"smaller than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  bVar3 = std::
          __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,std::_Rb_tree_const_iterator<std::pair<int_const,int>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((t2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
                     (t1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"greater than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  bVar3 = std::
          __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,std::_Rb_tree_const_iterator<std::pair<int_const,int>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((t1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,
                     (t2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1);
  if (!bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"greater than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  if (s2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1150d0);
  }
  else {
    sVar4 = strlen(s2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void 	relational_operator(T const & t1, char const * s1, T const & t2, char const * s2) {
	std::cout << s1 << " is..." << std::endl;

	if (t1 == t2) std::cout << "equal to" << std::endl;
	if (t1 != t2) std::cout << "not equal to" << std::endl;
	if (t1 < t2) std::cout << "smaller than" << std::endl;
	if (t1 <= t2) std::cout << "smaller than or equal to" << std::endl;
	if (t1 > t2) std::cout << "greater than" << std::endl;
	if (t1 >= t2) std::cout << "greater than or equal to" << std::endl;

	std::cout << s2 << "!\n" << std::endl;
}